

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reset.cpp
# Opt level: O2

void __thiscall
Reset_resetRemoveResetValueId_Test::~Reset_resetRemoveResetValueId_Test
          (Reset_resetRemoveResetValueId_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Reset, resetRemoveResetValueId)
{
    libcellml::ResetPtr r = libcellml::Reset::create();

    EXPECT_EQ("", r->resetValueId());

    r->setResetValueId("id1");

    EXPECT_EQ("id1", r->resetValueId());

    r->removeResetValueId();

    EXPECT_EQ("", r->resetValueId());
}